

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

string * __thiscall
bloaty::(anonymous_namespace)::SiPrint_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int64_t size,bool force_sign)

{
  char cVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined8 *puVar3;
  double d;
  double dVar4;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string ret;
  
  cVar1 = (char)size;
  d = (double)(long)this;
  puVar3 = (undefined8 *)&DAT_005ba230;
  for (uVar2 = 0; (dVar4 = ABS(d), 1024.0 < dVar4 && (uVar2 < 3)); uVar2 = uVar2 + 1) {
    d = d * 0.0009765625;
    puVar3 = puVar3 + 1;
  }
  ret._M_dataplus._M_p = (pointer)&ret.field_2;
  ret._M_string_length = 0;
  ret.field_2._M_local_buf[0] = '\0';
  if (uVar2 != 0 && dVar4 <= 100.0) {
    if (dVar4 <= 10.0) {
      if (cVar1 == '\0') {
        DoubleStringPrintf_abi_cxx11_(&local_80,(_anonymous_namespace_ *)"%0.2f",(char *)size,d);
        std::operator+(&local_60,&local_80,(char *)*puVar3);
      }
      else {
        DoubleStringPrintf_abi_cxx11_(&local_80,(_anonymous_namespace_ *)"%+0.2f",(char *)size,d);
        std::operator+(&local_60,&local_80,(char *)*puVar3);
      }
    }
    else if (cVar1 == '\0') {
      DoubleStringPrintf_abi_cxx11_(&local_80,(_anonymous_namespace_ *)"%0.1f",(char *)size,d);
      std::operator+(&local_60,&local_80,(char *)*puVar3);
    }
    else {
      DoubleStringPrintf_abi_cxx11_(&local_80,(_anonymous_namespace_ *)"%+0.1f",(char *)size,d);
      std::operator+(&local_60,&local_80,(char *)*puVar3);
    }
    std::__cxx11::string::operator=((string *)&ret,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = &local_80;
  }
  else {
    std::__cxx11::to_string(&local_80,(long)d);
    std::operator+(&local_60,&local_80,(char *)*puVar3);
    std::__cxx11::string::operator=((string *)&ret,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    if (cVar1 != '\x01' || (long)this < 1) goto LAB_0016adef;
    std::operator+(&local_60,"+",&ret);
    this_00 = &local_60;
    std::__cxx11::string::operator=((string *)&ret,(string *)this_00);
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0016adef:
  anon_unknown_34::LeftPad(__return_storage_ptr__,&ret,7);
  std::__cxx11::string::~string((string *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string SiPrint(int64_t size, bool force_sign) {
  const char* prefixes[] = {"", "Ki", "Mi", "Gi", "Ti"};
  size_t num_prefixes = 5;
  size_t n = 0;
  double size_d = size;
  while (fabs(size_d) > 1024 && n < num_prefixes - 2) {
    size_d /= 1024;
    n++;
  }

  std::string ret;

  if (fabs(size_d) > 100 || n == 0) {
    ret = std::to_string(static_cast<int64_t>(size_d)) + prefixes[n];
    if (force_sign && size > 0) {
      ret = "+" + ret;
    }
  } else if (fabs(size_d) > 10) {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.1f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.1f", size_d) + prefixes[n];
    }
  } else {
    if (force_sign) {
      ret = DoubleStringPrintf("%+0.2f", size_d) + prefixes[n];
    } else {
      ret = DoubleStringPrintf("%0.2f", size_d) + prefixes[n];
    }
  }

  return LeftPad(ret, 7);
}